

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autobondrot.c
# Opt level: O0

void addGoToRecord(xformDatabase *xdb,char *rec)

{
  goToRec *pgVar1;
  char *pcVar2;
  double dVar3;
  goToRec *g;
  char *pcStack_20;
  int i;
  char *p;
  char *rec_local;
  xformDatabase *xdb_local;
  
  if ((xdb != (xformDatabase *)0x0) && (rec != (char *)0x0)) {
    pgVar1 = (goToRec *)malloc(0x48);
    if (pgVar1 == (goToRec *)0x0) {
      warn("could not create \'go to\' record");
    }
    else {
      pgVar1->next = (goToRec_t *)0x0;
      for (g._4_4_ = 0; g._4_4_ < 8; g._4_4_ = g._4_4_ + 1) {
        pgVar1->level[g._4_4_] = 0.0;
      }
      if (xdb->golist == (goToRec *)0x0) {
        xdb->golist = pgVar1;
      }
      if (xdb->glast != (goToRec *)0x0) {
        xdb->glast->next = pgVar1;
      }
      xdb->glast = pgVar1;
      pcVar2 = strtok(rec,":");
      if (pcVar2 != (char *)0x0) {
        pcStack_20 = strtok((char *)0x0,":");
        for (g._4_4_ = 0; pcStack_20 != (char *)0x0 && g._4_4_ < 8; g._4_4_ = g._4_4_ + 1) {
          dVar3 = atof(pcStack_20);
          pgVar1->level[g._4_4_] = dVar3;
          pcStack_20 = strtok((char *)0x0,":");
        }
      }
    }
  }
  return;
}

Assistant:

void addGoToRecord(xformDatabase* xdb, char *rec) {
   char *p = NULL;
   int i = 0;
   goToRec* g = NULL;

   if (xdb && rec) {
      g = (goToRec *)malloc(sizeof(goToRec));
      if (!g) {
         warn("could not create 'go to' record");
         return;
      }

      /* initialize */
      g->next = NULL;
      for(i = 0; i < MAX_XFORM_LEVELS; i++) {
         g->level[i] = 0.0;
      }

      if (! xdb->golist) { xdb->golist = g; }
      if (xdb->glast) { xdb->glast->next = g; }
      xdb->glast = g;

      p = strtok(rec, XFORMREC_DELIM); /* type id */
      if (p) {
	 p = strtok(NULL, XFORMREC_DELIM);
	 for(i=0; p && (i < MAX_XFORM_LEVELS); i++) {
	    g->level[i] = atof(p);
	    p = strtok(NULL, XFORMREC_DELIM);
	 }
      }
   }
}